

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O1

void __thiscall embree::BVHN<4>::clear(BVHN<4> *this)

{
  bool bVar1;
  pointer ppTVar2;
  Device *pDVar3;
  Block *pBVar4;
  size_t sVar5;
  PrimRef *ptr;
  MemoryMonitorInterface *pMVar6;
  long lVar7;
  __pointer_type pBVar8;
  pointer ppTVar9;
  
  (this->root).ptr = 8;
  *(undefined8 *)&(this->super_AccelData).bounds.bounds0.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(this->super_AccelData).bounds.bounds0.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(this->super_AccelData).bounds.bounds0.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(this->super_AccelData).bounds.bounds0.upper.field_0 + 8) =
       0xff800000ff800000;
  *(undefined8 *)&(this->super_AccelData).bounds.bounds1.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(this->super_AccelData).bounds.bounds1.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(this->super_AccelData).bounds.bounds1.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(this->super_AccelData).bounds.bounds1.upper.field_0 + 8) =
       0xff800000ff800000;
  this->numPrimitives = 0;
  FastAllocator::internal_fix_used_blocks(&this->alloc);
  ppTVar2 = (this->alloc).thread_local_allocators.
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar9 = (this->alloc).thread_local_allocators.
                 super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppTVar9 != ppTVar2;
      ppTVar9 = ppTVar9 + 1) {
    FastAllocator::ThreadLocal2::unbind(*ppTVar9,&this->alloc);
  }
  ppTVar9 = (this->alloc).thread_local_allocators.
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->alloc).thread_local_allocators.
      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar9) {
    (this->alloc).thread_local_allocators.
    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppTVar9;
  }
  LOCK();
  (this->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  if ((this->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
    pDVar3 = (this->alloc).device;
    bVar1 = (this->alloc).useUSM;
    pBVar8 = (this->alloc).usedBlocks._M_b._M_p;
    do {
      pBVar4 = pBVar8->next;
      FastAllocator::Block::clear_block(pBVar8,pDVar3,bVar1);
      pBVar8 = pBVar4;
    } while (pBVar4 != (Block *)0x0);
  }
  LOCK();
  (this->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if ((this->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
    pDVar3 = (this->alloc).device;
    bVar1 = (this->alloc).useUSM;
    pBVar8 = (this->alloc).freeBlocks._M_b._M_p;
    do {
      pBVar4 = pBVar8->next;
      FastAllocator::Block::clear_block(pBVar8,pDVar3,bVar1);
      pBVar8 = pBVar4;
    } while (pBVar4 != (Block *)0x0);
  }
  LOCK();
  (this->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  lVar7 = -8;
  do {
    LOCK();
    (this->alloc).threadBlocks[lVar7]._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    LOCK();
    (this->alloc).threadBlocks[lVar7 + 8]._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0);
  sVar5 = (this->alloc).primrefarray.size_alloced;
  ptr = (this->alloc).primrefarray.items;
  if (ptr != (PrimRef *)0x0) {
    if (sVar5 << 5 < 0x1c00000) {
      alignedFree(ptr);
    }
    else {
      os_free(ptr,sVar5 << 5,(this->alloc).primrefarray.alloc.hugepages);
    }
  }
  if (sVar5 != 0) {
    pMVar6 = (this->alloc).primrefarray.alloc.device;
    (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,sVar5 * -0x20,1);
  }
  (this->alloc).primrefarray.size_active = 0;
  (this->alloc).primrefarray.size_alloced = 0;
  (this->alloc).primrefarray.items = (PrimRef *)0x0;
  return;
}

Assistant:

void BVHN<N>::clear()
  {
    set(BVHN::emptyNode,empty,0);
    alloc.clear();
  }